

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_and_time.c
# Opt level: O0

LY_ERR lyplg_type_compare_date_and_time(ly_ctx *UNUSED_ctx,lyd_value *val1,lyd_value *val2)

{
  int iVar1;
  lyd_value_date_and_time *v2;
  lyd_value_date_and_time *v1;
  lyd_value *val2_local;
  lyd_value *val1_local;
  ly_ctx *UNUSED_ctx_local;
  
  if (((val1->field_2).dec64 == (val2->field_2).dec64) &&
     ((val1->field_2).fixed_mem[0x10] == (val2->field_2).fixed_mem[0x10])) {
    if (((*(long *)((long)&val1->field_2 + 8) == 0) && (*(long *)((long)&val2->field_2 + 8) == 0))
       || ((*(long *)((long)&val1->field_2 + 8) != 0 &&
           ((*(long *)((long)&val2->field_2 + 8) != 0 &&
            (iVar1 = strcmp(*(char **)((long)&val1->field_2 + 8),
                            *(char **)((long)&val2->field_2 + 8)), iVar1 == 0)))))) {
      UNUSED_ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      UNUSED_ctx_local._4_4_ = LY_ENOT;
    }
    return UNUSED_ctx_local._4_4_;
  }
  return LY_ENOT;
}

Assistant:

static LY_ERR
lyplg_type_compare_date_and_time(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *val1,
        const struct lyd_value *val2)
{
    struct lyd_value_date_and_time *v1, *v2;

    LYD_VALUE_GET(val1, v1);
    LYD_VALUE_GET(val2, v2);

    /* compare timestamp and unknown tz */
    if ((v1->time != v2->time) || (v1->unknown_tz != v2->unknown_tz)) {
        return LY_ENOT;
    }

    /* compare second fractions */
    if ((!v1->fractions_s && !v2->fractions_s) ||
            (v1->fractions_s && v2->fractions_s && !strcmp(v1->fractions_s, v2->fractions_s))) {
        return LY_SUCCESS;
    }
    return LY_ENOT;
}